

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O0

void xml_error_strings(TidyDoc tdoc)

{
  ctmbstr ptVar1;
  TidyIterator local_28;
  TidyIterator j;
  ctmbstr localizedString;
  TidyDoc p_Stack_10;
  uint errorCode;
  TidyDoc tdoc_local;
  
  p_Stack_10 = tdoc;
  local_28 = getErrorCodeList();
  printf("<?xml version=\"1.0\"?>\n");
  ptVar1 = tidyLibraryVersion();
  printf("<error_strings version=\"%s\">\n",ptVar1);
  while (local_28 != (TidyIterator)0x0) {
    localizedString._4_4_ = getNextErrorCode(&local_28);
    j = (TidyIterator)tidyLocalizedString(localizedString._4_4_);
    printf(" <error_string>\n");
    ptVar1 = tidyErrorCodeAsKey(localizedString._4_4_);
    printf("  <name>%s</name>\n",ptVar1);
    if (j == (TidyIterator)0x0) {
      ptVar1 = tidyGetLanguage();
      printf("  <string class=\"%s\">NULL</string>\n",ptVar1);
    }
    else {
      ptVar1 = tidyGetLanguage();
      printf("  <string class=\"%s\"><![CDATA[%s]]></string>\n",ptVar1,j);
    }
    printf(" </error_string>\n");
  }
  printf("</error_strings>\n");
  return;
}

Assistant:

static void xml_error_strings( TidyDoc tdoc )
{
    uint errorCode;
    ctmbstr localizedString;
    TidyIterator j = getErrorCodeList();

    printf( "<?xml version=\"1.0\"?>\n" );
    printf( "<error_strings version=\"%s\">\n", tidyLibraryVersion());

    while (j) {
        errorCode = getNextErrorCode(&j);
        localizedString = tidyLocalizedString(errorCode);
        printf( " <error_string>\n" );
        printf( "  <name>%s</name>\n", tidyErrorCodeAsKey(errorCode));
        if ( localizedString )
            printf( "  <string class=\"%s\"><![CDATA[%s]]></string>\n", tidyGetLanguage(), localizedString );
        else
            printf( "  <string class=\"%s\">NULL</string>\n", tidyGetLanguage() );

        printf( " </error_string>\n" );
    }
    
    printf( "</error_strings>\n" );
}